

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

int uv_interface_addresses(uv_interface_address_t **addresses,int *count)

{
  sockaddr *psVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uv_interface_address_t *puVar6;
  char *pcVar7;
  ifaddrs *piVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  in_addr_t iVar11;
  undefined4 uVar12;
  ifaddrs *addrs;
  
  *count = 0;
  *addresses = (uv_interface_address_t *)0x0;
  piVar8 = (ifaddrs *)&addrs;
  iVar3 = getifaddrs(piVar8);
  if (iVar3 == 0) {
    while (piVar8 = piVar8->ifa_next, piVar8 != (ifaddrs *)0x0) {
      iVar3 = uv__ifaddr_exclude(piVar8,1);
      if (iVar3 == 0) {
        *count = *count + 1;
      }
    }
    if ((long)*count != 0) {
      puVar6 = (uv_interface_address_t *)uv__malloc((long)*count * 0x50);
      *addresses = puVar6;
      if (puVar6 == (uv_interface_address_t *)0x0) {
        freeifaddrs(addrs);
        return -0xc;
      }
      piVar8 = (ifaddrs *)&addrs;
      while (piVar8 = piVar8->ifa_next, piVar8 != (ifaddrs *)0x0) {
        iVar3 = uv__ifaddr_exclude(piVar8,1);
        if (iVar3 == 0) {
          pcVar7 = uv__strdup(piVar8->ifa_name);
          puVar6->name = pcVar7;
          psVar1 = piVar8->ifa_addr;
          if (psVar1->sa_family == 10) {
            uVar9._0_2_ = psVar1->sa_family;
            uVar9._2_1_ = psVar1->sa_data[0];
            uVar9._3_1_ = psVar1->sa_data[1];
            iVar11 = *(in_addr_t *)(psVar1->sa_data + 2);
            uVar10 = *(undefined4 *)(psVar1->sa_data + 6);
            uVar12 = *(undefined4 *)(psVar1->sa_data + 10);
            uVar2 = *(undefined8 *)(psVar1[1].sa_data + 2);
            *(undefined8 *)((long)&puVar6->address + 0xc) = *(undefined8 *)(psVar1->sa_data + 10);
            *(undefined8 *)((long)&puVar6->address + 0x14) = uVar2;
          }
          else {
            uVar9._0_2_ = psVar1->sa_family;
            uVar9._2_1_ = psVar1->sa_data[0];
            uVar9._3_1_ = psVar1->sa_data[1];
            iVar11 = *(in_addr_t *)(psVar1->sa_data + 2);
            uVar10 = *(undefined4 *)(psVar1->sa_data + 6);
            uVar12 = *(undefined4 *)(psVar1->sa_data + 10);
          }
          *(undefined4 *)&puVar6->address = uVar9;
          (puVar6->address).address4.sin_addr.s_addr = iVar11;
          *(undefined4 *)((long)&puVar6->address + 8) = uVar10;
          *(undefined4 *)((long)&puVar6->address + 0xc) = uVar12;
          psVar1 = piVar8->ifa_netmask;
          if (psVar1->sa_family == 10) {
            uVar10._0_2_ = psVar1->sa_family;
            uVar10._2_1_ = psVar1->sa_data[0];
            uVar10._3_1_ = psVar1->sa_data[1];
            iVar11 = *(in_addr_t *)(psVar1->sa_data + 2);
            uVar9 = *(undefined4 *)(psVar1->sa_data + 6);
            uVar12 = *(undefined4 *)(psVar1->sa_data + 10);
            uVar2 = *(undefined8 *)(psVar1[1].sa_data + 2);
            *(undefined8 *)((long)&puVar6->netmask + 0xc) = *(undefined8 *)(psVar1->sa_data + 10);
            *(undefined8 *)((long)&puVar6->netmask + 0x14) = uVar2;
          }
          else {
            uVar10._0_2_ = psVar1->sa_family;
            uVar10._2_1_ = psVar1->sa_data[0];
            uVar10._3_1_ = psVar1->sa_data[1];
            iVar11 = *(in_addr_t *)(psVar1->sa_data + 2);
            uVar9 = *(undefined4 *)(psVar1->sa_data + 6);
            uVar12 = *(undefined4 *)(psVar1->sa_data + 10);
          }
          *(undefined4 *)&puVar6->netmask = uVar10;
          (puVar6->netmask).netmask4.sin_addr.s_addr = iVar11;
          *(undefined4 *)((long)&puVar6->netmask + 8) = uVar9;
          *(undefined4 *)((long)&puVar6->netmask + 0xc) = uVar12;
          puVar6->is_internal = piVar8->ifa_flags >> 3 & 1;
          puVar6 = puVar6 + 1;
        }
      }
      piVar8 = (ifaddrs *)&addrs;
      while (piVar8 = piVar8->ifa_next, piVar8 != (ifaddrs *)0x0) {
        iVar3 = uv__ifaddr_exclude(piVar8,0);
        if (iVar3 == 0) {
          pcVar7 = (*addresses)->phys_addr;
          for (iVar3 = 0; iVar3 < *count; iVar3 = iVar3 + 1) {
            iVar4 = strcmp(((uv_interface_address_t *)(pcVar7 + -8))->name,piVar8->ifa_name);
            if (iVar4 == 0) {
              psVar1 = piVar8->ifa_addr;
              *(sa_family_t *)(pcVar7 + 4) = psVar1[1].sa_family;
              *(undefined4 *)pcVar7 = *(undefined4 *)(psVar1->sa_data + 10);
            }
            else {
              pcVar7[4] = '\0';
              pcVar7[5] = '\0';
              pcVar7[0] = '\0';
              pcVar7[1] = '\0';
              pcVar7[2] = '\0';
              pcVar7[3] = '\0';
            }
            pcVar7 = pcVar7 + 0x50;
          }
        }
      }
    }
    freeifaddrs(addrs);
    iVar3 = 0;
  }
  else {
    piVar5 = __errno_location();
    iVar3 = -*piVar5;
  }
  return iVar3;
}

Assistant:

int uv_interface_addresses(uv_interface_address_t** addresses, int* count) {
#ifndef HAVE_IFADDRS_H
  *count = 0;
  *addresses = NULL;
  return UV_ENOSYS;
#else
  struct ifaddrs *addrs, *ent;
  uv_interface_address_t* address;
  int i;
  struct sockaddr_ll *sll;

  *count = 0;
  *addresses = NULL;

  if (getifaddrs(&addrs))
    return UV__ERR(errno);

  /* Count the number of interfaces */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    (*count)++;
  }

  if (*count == 0) {
    freeifaddrs(addrs);
    return 0;
  }

  *addresses = uv__malloc(*count * sizeof(**addresses));
  if (!(*addresses)) {
    freeifaddrs(addrs);
    return UV_ENOMEM;
  }

  address = *addresses;

  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    address->name = uv__strdup(ent->ifa_name);

    if (ent->ifa_addr->sa_family == AF_INET6) {
      address->address.address6 = *((struct sockaddr_in6*) ent->ifa_addr);
    } else {
      address->address.address4 = *((struct sockaddr_in*) ent->ifa_addr);
    }

    if (ent->ifa_netmask->sa_family == AF_INET6) {
      address->netmask.netmask6 = *((struct sockaddr_in6*) ent->ifa_netmask);
    } else {
      address->netmask.netmask4 = *((struct sockaddr_in*) ent->ifa_netmask);
    }

    address->is_internal = !!(ent->ifa_flags & IFF_LOOPBACK);

    address++;
  }

  /* Fill in physical addresses for each interface */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFPHYS))
      continue;

    address = *addresses;

    for (i = 0; i < (*count); i++) {
      if (strcmp(address->name, ent->ifa_name) == 0) {
        sll = (struct sockaddr_ll*)ent->ifa_addr;
        memcpy(address->phys_addr, sll->sll_addr, sizeof(address->phys_addr));
      } else {
        memset(address->phys_addr, 0, sizeof(address->phys_addr));
      }
      address++;
    }
  }

  freeifaddrs(addrs);

  return 0;
#endif
}